

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerManager.cpp
# Opt level: O2

void __thiscall TimerManager::removeTimedEvent(TimerManager *this,Event *ev)

{
  uint i;
  ulong uVar1;
  AutoLock l;
  AutoLock local_30;
  
  AutoLock::AutoLock(&local_30,&this->mMutex);
  for (uVar1 = 0; uVar1 < (this->mTimers).mSize; uVar1 = uVar1 + 1) {
    Timer::removeTimedEvent((this->mTimers).mData[uVar1],ev);
  }
  AutoLock::~AutoLock(&local_30);
  return;
}

Assistant:

void TimerManager::removeTimedEvent( Event *ev )
{
	TRACE_BEGIN(LOG_LVL_NOISE);

	// Lock mutex while accessing/modifying mTimers vector
	AutoLock l(mMutex);
	
	for (unsigned i = 0; i < mTimers.size(); ++i)
	{
		mTimers[i]->removeTimedEvent(ev);
	}
	
}